

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polycurve.cpp
# Opt level: O0

bool __thiscall ON_PolyCurve::CloseGap(ON_PolyCurve *this,int gap_index,int ends_to_modify)

{
  ON_Object *p;
  ON_Object *p_00;
  ON_3dPoint P;
  ON_3dPoint P_00;
  ON_3dPoint Q;
  ON_3dPoint Q_00;
  bool bVar1;
  int iVar2;
  ON_Curve **ppOVar3;
  ON_ArcCurve *arc;
  ON_ArcCurve *arc_00;
  ON_NurbsCurve *pOVar4;
  double dVar5;
  double dVar6;
  bool local_1e4;
  bool local_1e2;
  ON_NurbsCurve *nc1;
  ON_NurbsCurve *nc0;
  bool bLine1;
  bool bLine0;
  double is_linear_tolerance;
  double min_line_length;
  undefined1 local_108 [8];
  ON_Line line1;
  ON_Line line0;
  ON_ArcCurve *arc1;
  ON_ArcCurve *arc0;
  ON_3dPoint Q1;
  ON_3dPoint Q0;
  ON_3dPoint P1;
  ON_3dPoint P0;
  ON_Curve *c1;
  ON_Curve *c0;
  int count;
  int ends_to_modify_local;
  int gap_index_local;
  ON_PolyCurve *this_local;
  
  iVar2 = ON_SimpleArray<ON_Curve_*>::Count(&(this->m_segment).super_ON_SimpleArray<ON_Curve_*>);
  if ((gap_index < 1) || (iVar2 <= gap_index)) {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_polycurve.cpp"
               ,0x4b0,"","Invalid gap_index parameter.");
    this_local._7_1_ = false;
  }
  else {
    ppOVar3 = ON_SimpleArray<ON_Curve_*>::operator[]
                        (&(this->m_segment).super_ON_SimpleArray<ON_Curve_*>,gap_index + -1);
    p = (ON_Object *)*ppOVar3;
    ppOVar3 = ON_SimpleArray<ON_Curve_*>::operator[]
                        (&(this->m_segment).super_ON_SimpleArray<ON_Curve_*>,gap_index);
    p_00 = (ON_Object *)*ppOVar3;
    if ((p == (ON_Object *)0x0) || (p_00 == (ON_Object *)0x0)) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_polycurve.cpp"
                 ,0x4b8,"","Null curve segments.");
      this_local._7_1_ = false;
    }
    else {
      ON_Curve::PointAtEnd((ON_3dPoint *)&P1.z,(ON_Curve *)p);
      ON_Curve::PointAtStart((ON_3dPoint *)&Q0.z,(ON_Curve *)p_00);
      bVar1 = ON_3dPoint::operator==((ON_3dPoint *)&P1.z,(ON_3dPoint *)&Q0.z);
      if (bVar1) {
        this_local._7_1_ = false;
      }
      else {
        Q1.z = P1.z;
        Q0.x = P0.x;
        Q0.y = P0.y;
        arc0 = (ON_ArcCurve *)Q0.z;
        Q1.x = P1.x;
        Q1.y = P1.y;
        arc = ON_ArcCurve::Cast(p);
        arc_00 = ON_ArcCurve::Cast(p_00);
        if ((arc == (ON_ArcCurve *)0x0) || (arc_00 == (ON_ArcCurve *)0x0)) {
          if ((arc == (ON_ArcCurve *)0x0) || (arc_00 != (ON_ArcCurve *)0x0)) {
            if ((arc_00 == (ON_ArcCurve *)0x0) || (arc != (ON_ArcCurve *)0x0)) {
              ON_Line::ON_Line((ON_Line *)&line1.to.z);
              ON_Line::ON_Line((ON_Line *)local_108);
              if (arc == (ON_ArcCurve *)0x0) {
                local_1e2 = ON_Curve::LastSpanIsLinear((ON_Curve *)p,0.0,0.0,(ON_Line *)&line1.to.z)
                ;
                local_1e4 = ON_Curve::FirstSpanIsLinear
                                      ((ON_Curve *)p_00,0.0,0.0,(ON_Line *)local_108);
              }
              else {
                local_1e2 = false;
                local_1e4 = false;
              }
              if ((local_1e2 == false) || (local_1e4 == false)) {
                if (local_1e2 == false) {
                  if (local_1e4 != false) {
                    SetLineIsoCoords((ON_Line *)local_108,(ON_3dPoint *)&Q0.z,(ON_3dPoint *)&Q1.z);
                  }
                }
                else {
                  SetLineIsoCoords((ON_Line *)&line1.to.z,(ON_3dPoint *)&P1.z,(ON_3dPoint *)&arc0);
                }
              }
              else {
                LineLineTieBreaker((ON_Line *)&line1.to.z,(ON_Line *)local_108,(ON_3dPoint *)&Q1.z,
                                   (ON_3dPoint *)&arc0);
              }
              ON_Line::~ON_Line((ON_Line *)local_108);
              ON_Line::~ON_Line((ON_Line *)&line1.to.z);
            }
            else {
              Q1.z = Q0.z;
              Q0.x = P1.x;
              Q0.y = P1.y;
            }
          }
          else {
            arc0 = (ON_ArcCurve *)P1.z;
            Q1.x = P0.x;
            Q1.y = P0.y;
          }
        }
        else {
          dVar5 = ON_Arc::Length(&arc_00->m_arc);
          dVar6 = ON_Arc::Length(&arc->m_arc);
          if (dVar6 <= dVar5) {
            Q1.z = Q0.z;
            Q0.x = P1.x;
            Q0.y = P1.y;
          }
          else {
            arc0 = (ON_ArcCurve *)P1.z;
            Q1.x = P0.x;
            Q1.y = P0.y;
          }
        }
        if ((Q1.z != (double)arc0) || (NAN(Q1.z) || NAN((double)arc0))) {
          arc0 = (ON_ArcCurve *)((P1.z + Q0.z) * 0.5);
          Q1.z = (double)arc0;
        }
        if ((Q0.x != Q1.x) || (NAN(Q0.x) || NAN(Q1.x))) {
          Q1.x = (P0.x + P1.x) * 0.5;
          Q0.x = Q1.x;
        }
        if ((Q0.y != Q1.y) || (NAN(Q0.y) || NAN(Q1.y))) {
          Q1.y = (P0.y + P1.y) * 0.5;
          Q0.y = Q1.y;
        }
        bVar1 = ON_3dPoint::operator!=((ON_3dPoint *)&Q1.z,(ON_3dPoint *)&P1.z);
        if (bVar1) {
          if (arc == (ON_ArcCurve *)0x0) {
            (*p->_vptr_ON_Object[0x3a])();
          }
          else {
            P.y = P0.x;
            P.x = P1.z;
            P.z = P0.y;
            Q.y = Q0.x;
            Q.x = Q1.z;
            Q.z = Q0.y;
            pOVar4 = ChangeArcEnd(arc,P,Q,1);
            if (pOVar4 != (ON_NurbsCurve *)0x0) {
              ppOVar3 = ON_SimpleArray<ON_Curve_*>::operator[]
                                  (&(this->m_segment).super_ON_SimpleArray<ON_Curve_*>,
                                   gap_index + -1);
              if (*ppOVar3 != (ON_Curve *)0x0) {
                (*((*ppOVar3)->super_ON_Geometry).super_ON_Object._vptr_ON_Object[4])();
              }
              ppOVar3 = ON_SimpleArray<ON_Curve_*>::operator[]
                                  (&(this->m_segment).super_ON_SimpleArray<ON_Curve_*>,
                                   gap_index + -1);
              *ppOVar3 = &pOVar4->super_ON_Curve;
            }
          }
        }
        bVar1 = ON_3dPoint::operator!=((ON_3dPoint *)&arc0,(ON_3dPoint *)&Q0.z);
        if (bVar1) {
          if (arc_00 == (ON_ArcCurve *)0x0) {
            (*p_00->_vptr_ON_Object[0x39])();
          }
          else {
            P_00.y = P1.x;
            P_00.x = Q0.z;
            P_00.z = P1.y;
            Q_00.y = Q1.x;
            Q_00.x = (double)arc0;
            Q_00.z = Q1.y;
            pOVar4 = ChangeArcEnd(arc_00,P_00,Q_00,0);
            if (pOVar4 != (ON_NurbsCurve *)0x0) {
              ppOVar3 = ON_SimpleArray<ON_Curve_*>::operator[]
                                  (&(this->m_segment).super_ON_SimpleArray<ON_Curve_*>,gap_index);
              if (*ppOVar3 != (ON_Curve *)0x0) {
                (*((*ppOVar3)->super_ON_Geometry).super_ON_Object._vptr_ON_Object[4])();
              }
              ppOVar3 = ON_SimpleArray<ON_Curve_*>::operator[]
                                  (&(this->m_segment).super_ON_SimpleArray<ON_Curve_*>,gap_index);
              *ppOVar3 = &pOVar4->super_ON_Curve;
            }
          }
        }
        bVar1 = HasGapAt(this,gap_index + -1);
        this_local._7_1_ = (bool)(bVar1 - 1U & 1);
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool ON_PolyCurve::CloseGap( int gap_index, int ends_to_modify )
{
  const int count = m_segment.Count();

  if ( gap_index <= 0 || gap_index >= count )
  {
    ON_ERROR("Invalid gap_index parameter.");
    return 0; // nothing to do
  }

  ON_Curve* c0 = m_segment[gap_index-1];
  ON_Curve* c1 = m_segment[gap_index];
  if ( 0 == c0 || 0 == c1 )
  {
    ON_ERROR("Null curve segments.");
    return false; // invalid polycurve
  }

  const ON_3dPoint P0 = c0->PointAtEnd();
  const ON_3dPoint P1 = c1->PointAtStart();
  if ( P0 == P1 )
    return false; // nothing to do

  ON_3dPoint Q0(P0);
  ON_3dPoint Q1(P1);

  const ON_ArcCurve* arc0 = ON_ArcCurve::Cast(c0);
  const ON_ArcCurve* arc1 = ON_ArcCurve::Cast(c1);

  if ( 0 != arc0 && 0 != arc1 )
  {
    if ( arc1->m_arc.Length() < arc0->m_arc.Length() )
      Q1 = P0;
    else
      Q0 = P1;
  }
  else if ( 0 != arc0 && 0 == arc1 )
  {
    Q1 = P0;
  }
  else if ( 0 != arc1 && 0 == arc0 )
  {
    Q0 = P1;
  }
  else
  {
    ON_Line line0, line1;
    double min_line_length = 0.0;
    double is_linear_tolerance = 0.0;
    bool bLine0 = (0 == arc0)
                ? c0->LastSpanIsLinear(min_line_length,is_linear_tolerance,&line0)
                : false;
    bool bLine1 = (0 == arc0)
                ? c1->FirstSpanIsLinear(min_line_length,is_linear_tolerance,&line1)
                : false;
    if ( bLine0 && bLine1 )
      LineLineTieBreaker(line0,line1,Q0,Q1);
    else if ( bLine0 )
      SetLineIsoCoords(line0,P0,Q1);
    else if ( bLine1 )
      SetLineIsoCoords(line1,P1,Q0);
  }

  if ( Q0.x != Q1.x )
    Q0.x = Q1.x = 0.5*(P0.x + P1.x);
  if ( Q0.y != Q1.y )
    Q0.y = Q1.y = 0.5*(P0.y + P1.y);
  if ( Q0.z != Q1.z )
    Q0.z = Q1.z = 0.5*(P0.z + P1.z);

  if ( Q0 != P0 )
  {
    if ( 0 != arc0 )
    {
      ON_NurbsCurve* nc0 = ChangeArcEnd( arc0, P0, Q0 , 1 );
      if ( nc0 )
      {
        delete m_segment[gap_index-1];
        m_segment[gap_index-1] = nc0;
        c0 = nc0;
        arc0 = 0;
      }
    }
    else
    {
      c0->SetEndPoint(Q0);
    }
  }

  if ( Q1 != P1 )
  {
    if ( 0 != arc1 )
    {
      ON_NurbsCurve* nc1 = ChangeArcEnd( arc1, P1, Q1, 0 );
      if ( nc1 )
      {
        delete m_segment[gap_index];
        m_segment[gap_index] = nc1;
        c0 = nc1;
        arc1 = 0;
      }
    }
    else
    {
      c1->SetStartPoint(Q1);
    }
  }

  return HasGapAt(gap_index-1) ? false : true;
}